

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::Average(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc)

{
  float *pfVar1;
  pointer pdVar2;
  size_t sVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar13;
  float *pfVar14;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  vector<double,_std::allocator<double>_> sum;
  ImageChannelValues *average;
  ImageChannelValues v;
  long local_90;
  float local_84;
  vector<double,_std::allocator<double>_> local_80;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_68;
  undefined1 local_60 [48];
  
  local_60._0_8_ = (memory_resource *)0x0;
  local_68 = &__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_80,(desc->offset).nStored,(value_type_conflict3 *)local_60,
             (allocator_type *)&local_84);
  if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
    local_90 = 0;
    do {
      if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
        uVar16 = 0;
        do {
          GetChannels((ImageChannelValues *)local_60,this,(Point2i)(local_90 << 0x20 | uVar16),desc,
                      (WrapMode2D)0x200000002);
          sVar3 = (desc->offset).nStored;
          auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (sVar3 != 0) {
            pfVar14 = (float *)local_60._8_8_;
            if ((float *)local_60._8_8_ == (float *)0x0) {
              pfVar14 = (float *)(local_60 + 0x10);
            }
            auVar21 = vpbroadcastq_avx512f();
            uVar17 = 0;
            do {
              auVar22 = vpbroadcastq_avx512f();
              auVar22 = vporq_avx512f(auVar22,auVar20);
              uVar12 = vpcmpuq_avx512f(auVar22,auVar21,2);
              pfVar1 = pfVar14 + uVar17;
              bVar5 = (byte)uVar12;
              auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * (int)pfVar1[1];
              auVar19._0_4_ = (uint)(bVar5 & 1) * (int)*pfVar1;
              auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * (int)pfVar1[2];
              auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * (int)pfVar1[3];
              auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * (int)pfVar1[4];
              auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * (int)pfVar1[5];
              auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * (int)pfVar1[6];
              auVar19._28_4_ = (uint)(byte)(uVar12 >> 7) * (int)pfVar1[7];
              auVar22 = vcvtps2pd_avx512f(auVar19);
              pdVar2 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar17;
              auVar23._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)pdVar2[1];
              auVar23._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar2;
              auVar23._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (long)pdVar2[2];
              auVar23._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)pdVar2[3];
              auVar23._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * (long)pdVar2[4];
              auVar23._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * (long)pdVar2[5];
              auVar23._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * (long)pdVar2[6];
              auVar23._56_8_ = (uVar12 >> 7) * (long)pdVar2[7];
              auVar22 = vaddpd_avx512f(auVar23,auVar22);
              pdVar2 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar17;
              bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
              *pdVar2 = (double)((ulong)(bVar5 & 1) * auVar22._0_8_ |
                                (ulong)!(bool)(bVar5 & 1) * (long)*pdVar2);
              pdVar2[1] = (double)((ulong)bVar6 * auVar22._8_8_ | (ulong)!bVar6 * (long)pdVar2[1]);
              pdVar2[2] = (double)((ulong)bVar7 * auVar22._16_8_ | (ulong)!bVar7 * (long)pdVar2[2]);
              pdVar2[3] = (double)((ulong)bVar8 * auVar22._24_8_ | (ulong)!bVar8 * (long)pdVar2[3]);
              pdVar2[4] = (double)((ulong)bVar9 * auVar22._32_8_ | (ulong)!bVar9 * (long)pdVar2[4]);
              pdVar2[5] = (double)((ulong)bVar10 * auVar22._40_8_ | (ulong)!bVar10 * (long)pdVar2[5]
                                  );
              pdVar2[6] = (double)((ulong)bVar11 * auVar22._48_8_ | (ulong)!bVar11 * (long)pdVar2[6]
                                  );
              pdVar2[7] = (double)((uVar12 >> 7) * auVar22._56_8_ |
                                  (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar2[7]);
              uVar17 = uVar17 + 8;
            } while ((sVar3 + 7 & 0xfffffffffffffff8) != uVar17);
          }
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_60);
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
      }
      local_90 = local_90 + 1;
    } while (local_90 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
  }
  sVar3 = (desc->offset).nStored;
  local_84 = 0.0;
  local_60._0_8_ = pstd::pmr::new_delete_resource();
  pIVar13 = local_68;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (local_68,sVar3,&local_84,(polymorphic_allocator<float> *)local_60);
  sVar3 = (desc->offset).nStored;
  if (sVar3 != 0) {
    paVar15 = &pIVar13->field_2;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)pIVar13->ptr !=
        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)0x0) {
      paVar15 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)pIVar13->ptr;
    }
    sVar18 = 0;
    do {
      TVar4 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      paVar15->fixed[sVar18] =
           (float)(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar18] / (double)(TVar4.y * TVar4.x));
      sVar18 = sVar18 + 1;
    } while (sVar3 != sVar18);
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (ImageChannelValues *)pIVar13;
}

Assistant:

ImageChannelValues Image::Average(const ImageChannelDesc &desc) const {
    std::vector<double> sum(desc.size(), 0.);

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            for (int c = 0; c < desc.size(); ++c)
                sum[c] += v[c];
        }

    ImageChannelValues average(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        average[c] = sum[c] / (Resolution().x * Resolution().y);
    return average;
}